

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O0

Vec_Wrd_t * Vec_WrdStart(int nSize)

{
  Vec_Wrd_t *pVVar1;
  Vec_Wrd_t *p;
  int nSize_local;
  
  pVVar1 = Vec_WrdAlloc(nSize);
  pVVar1->nSize = nSize;
  memset(pVVar1->pArray,0,(long)nSize << 3);
  return pVVar1;
}

Assistant:

static inline Vec_Wrd_t * Vec_WrdStart( int nSize )
{
    Vec_Wrd_t * p;
    p = Vec_WrdAlloc( nSize );
    p->nSize = nSize;
    memset( p->pArray, 0, sizeof(word) * nSize );
    return p;
}